

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::DiscMiMBIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  uint uVar9;
  undefined4 uVar10;
  RayHit *pRVar11;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Scene *scene;
  float fVar18;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar38;
  float fVar39;
  undefined1 auVar37 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar58 [64];
  vbool<4> valid;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  DiscIntersectorHitM<4> hit;
  undefined1 local_130 [8];
  undefined1 local_128 [16];
  RTCHitN local_118 [8];
  float local_110;
  int local_10c;
  int local_108;
  uint local_104;
  anon_union_12_2_4062524c_for_Vec3<float>_1 local_100 [2];
  RTCFilterFunctionNArguments local_e8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  float local_78 [4];
  float local_68 [4];
  float local_58 [4];
  undefined1 local_48 [16];
  ulong uVar12;
  undefined1 auVar34 [64];
  
  pSVar4 = context->scene;
  uVar12 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar5 = (pSVar4->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar5->time_range).lower;
  fVar1 = pGVar5->fnumTimeSegments *
          (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar1) / ((pGVar5->time_range).upper - fVar1)
          );
  auVar28 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar28 = vminss_avx(auVar28,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar28 = vmaxss_avx(ZEXT816(0) << 0x20,auVar28);
  fVar1 = fVar1 - auVar28._0_4_;
  lVar13 = *(long *)&pGVar5[2].numPrimitives;
  lVar14 = (long)(int)auVar28._0_4_ * 0x38;
  lVar6 = *(long *)(lVar13 + lVar14);
  lVar7 = *(long *)(lVar13 + 0x10 + lVar14);
  auVar28 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar12);
  uVar15 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar29 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar15);
  uVar16 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar37 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar16);
  uVar17 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar32 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar17);
  auVar30 = vunpcklps_avx(auVar28,auVar37);
  auVar19 = vunpckhps_avx(auVar28,auVar37);
  auVar28 = vunpcklps_avx(auVar29,auVar32);
  auVar24 = vunpckhps_avx(auVar29,auVar32);
  auVar31 = vunpcklps_avx(auVar30,auVar28);
  auVar30 = vunpckhps_avx(auVar30,auVar28);
  auVar55 = vunpcklps_avx(auVar19,auVar24);
  lVar6 = *(long *)(lVar13 + 0x38 + lVar14);
  lVar13 = *(long *)(lVar13 + 0x48 + lVar14);
  auVar28 = *(undefined1 (*) [16])(lVar6 + uVar12 * lVar13);
  auVar29 = *(undefined1 (*) [16])(lVar6 + uVar15 * lVar13);
  auVar37 = *(undefined1 (*) [16])(lVar6 + uVar16 * lVar13);
  auVar32 = *(undefined1 (*) [16])(lVar6 + lVar13 * uVar17);
  auVar56 = vunpcklps_avx(auVar28,auVar37);
  auVar25 = vunpckhps_avx(auVar28,auVar37);
  auVar28 = vunpcklps_avx(auVar29,auVar32);
  auVar26 = vunpckhps_avx(auVar29,auVar32);
  auVar32 = vunpcklps_avx(auVar56,auVar28);
  auVar37 = vunpckhps_avx(auVar56,auVar28);
  auVar56 = vunpcklps_avx(auVar25,auVar26);
  auVar28 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar29 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar54._8_4_ = 0x3f800000;
  auVar54._0_8_ = &DAT_3f8000003f800000;
  auVar54._12_4_ = 0x3f800000;
  fVar21 = auVar28._0_4_;
  fVar22 = auVar28._4_4_;
  fVar23 = auVar28._8_4_;
  fVar41 = auVar28._12_4_;
  fVar46 = auVar29._0_4_;
  fVar47 = auVar29._4_4_;
  fVar48 = auVar29._8_4_;
  fVar49 = auVar29._12_4_;
  auVar28._0_4_ = fVar46 * auVar31._0_4_ + fVar21 * auVar32._0_4_;
  auVar28._4_4_ = fVar47 * auVar31._4_4_ + fVar22 * auVar32._4_4_;
  auVar28._8_4_ = fVar48 * auVar31._8_4_ + fVar23 * auVar32._8_4_;
  auVar28._12_4_ = fVar49 * auVar31._12_4_ + fVar41 * auVar32._12_4_;
  auVar32._0_4_ = fVar21 * auVar37._0_4_ + fVar46 * auVar30._0_4_;
  auVar32._4_4_ = fVar22 * auVar37._4_4_ + fVar47 * auVar30._4_4_;
  auVar32._8_4_ = fVar23 * auVar37._8_4_ + fVar48 * auVar30._8_4_;
  auVar32._12_4_ = fVar41 * auVar37._12_4_ + fVar49 * auVar30._12_4_;
  auVar31._0_4_ = fVar21 * auVar56._0_4_ + fVar46 * auVar55._0_4_;
  auVar31._4_4_ = fVar22 * auVar56._4_4_ + fVar47 * auVar55._4_4_;
  auVar31._8_4_ = fVar23 * auVar56._8_4_ + fVar48 * auVar55._8_4_;
  auVar31._12_4_ = fVar41 * auVar56._12_4_ + fVar49 * auVar55._12_4_;
  local_48 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar10 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar37._4_4_ = uVar10;
  auVar37._0_4_ = uVar10;
  auVar37._8_4_ = uVar10;
  auVar37._12_4_ = uVar10;
  auVar37 = vsubps_avx(auVar28,auVar37);
  uVar10 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar29._4_4_ = uVar10;
  auVar29._0_4_ = uVar10;
  auVar29._8_4_ = uVar10;
  auVar29._12_4_ = uVar10;
  auVar32 = vsubps_avx(auVar32,auVar29);
  uVar10 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar30._4_4_ = uVar10;
  auVar30._0_4_ = uVar10;
  auVar30._8_4_ = uVar10;
  auVar30._12_4_ = uVar10;
  auVar30 = vsubps_avx(auVar31,auVar30);
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar18 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar36 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar38 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar28 = ZEXT416((uint)(fVar38 * fVar38 + fVar36 * fVar36 + fVar18 * fVar18));
  auVar29 = vshufps_avx(auVar28,auVar28,0);
  auVar28 = vrcpps_avx(auVar29);
  fVar18 = auVar28._0_4_;
  auVar56._0_4_ = fVar18 * auVar29._0_4_;
  fVar59 = auVar28._4_4_;
  auVar56._4_4_ = fVar59 * auVar29._4_4_;
  fVar60 = auVar28._8_4_;
  auVar56._8_4_ = fVar60 * auVar29._8_4_;
  fVar61 = auVar28._12_4_;
  auVar56._12_4_ = fVar61 * auVar29._12_4_;
  auVar28 = vsubps_avx(auVar54,auVar56);
  fVar50 = auVar30._0_4_;
  fVar51 = auVar30._4_4_;
  fVar52 = auVar30._8_4_;
  fVar53 = auVar30._12_4_;
  fVar42 = auVar32._0_4_;
  fVar43 = auVar32._4_4_;
  fVar44 = auVar32._8_4_;
  fVar45 = auVar32._12_4_;
  fVar36 = auVar37._0_4_;
  fVar38 = auVar37._4_4_;
  fVar39 = auVar37._8_4_;
  fVar40 = auVar37._12_4_;
  local_88._0_4_ =
       (fVar36 * fVar1 + fVar42 * fVar2 + fVar50 * fVar3) * (fVar18 + fVar18 * auVar28._0_4_);
  local_88._4_4_ =
       (fVar38 * fVar1 + fVar43 * fVar2 + fVar51 * fVar3) * (fVar59 + fVar59 * auVar28._4_4_);
  local_88._8_4_ =
       (fVar39 * fVar1 + fVar44 * fVar2 + fVar52 * fVar3) * (fVar60 + fVar60 * auVar28._8_4_);
  local_88._12_4_ =
       (fVar40 * fVar1 + fVar45 * fVar2 + fVar53 * fVar3) * (fVar61 + fVar61 * auVar28._12_4_);
  auVar58 = ZEXT1664(local_88);
  uVar10 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar55._4_4_ = uVar10;
  auVar55._0_4_ = uVar10;
  auVar55._8_4_ = uVar10;
  auVar55._12_4_ = uVar10;
  auVar28 = vcmpps_avx(auVar55,local_88,2);
  fVar18 = (ray->super_RayK<1>).tfar;
  auVar57._4_4_ = fVar18;
  auVar57._0_4_ = fVar18;
  auVar57._8_4_ = fVar18;
  auVar57._12_4_ = fVar18;
  auVar29 = vcmpps_avx(local_88,auVar57,2);
  auVar28 = vandps_avx(auVar29,auVar28);
  auVar29 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar29 = vpcmpgtd_avx(auVar29,_DAT_01ff0cf0);
  auVar31 = auVar29 & auVar28;
  if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0') {
    auVar28 = vandps_avx(auVar28,auVar29);
    auVar29 = vunpckhps_avx(auVar19,auVar24);
    auVar19 = vunpckhps_avx(auVar25,auVar26);
    fVar18 = fVar46 * auVar29._0_4_ + fVar21 * auVar19._0_4_;
    fVar21 = fVar47 * auVar29._4_4_ + fVar22 * auVar19._4_4_;
    fVar22 = fVar48 * auVar29._8_4_ + fVar23 * auVar19._8_4_;
    fVar23 = fVar49 * auVar29._12_4_ + fVar41 * auVar19._12_4_;
    auVar24._0_4_ = local_88._0_4_ * fVar1;
    auVar24._4_4_ = local_88._4_4_ * fVar1;
    auVar24._8_4_ = local_88._8_4_ * fVar1;
    auVar24._12_4_ = local_88._12_4_ * fVar1;
    auVar26._0_4_ = local_88._0_4_ * fVar2;
    auVar26._4_4_ = local_88._4_4_ * fVar2;
    auVar26._8_4_ = local_88._8_4_ * fVar2;
    auVar26._12_4_ = local_88._12_4_ * fVar2;
    auVar35._0_4_ = local_88._0_4_ * fVar3;
    auVar35._4_4_ = local_88._4_4_ * fVar3;
    auVar35._8_4_ = local_88._8_4_ * fVar3;
    auVar35._12_4_ = local_88._12_4_ * fVar3;
    auVar29 = vsubps_avx(auVar37,auVar24);
    auVar37 = vsubps_avx(auVar32,auVar26);
    auVar32 = vsubps_avx(auVar30,auVar35);
    auVar25._0_4_ =
         auVar29._0_4_ * auVar29._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar32._0_4_ * auVar32._0_4_;
    auVar25._4_4_ =
         auVar29._4_4_ * auVar29._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar32._4_4_ * auVar32._4_4_;
    auVar25._8_4_ =
         auVar29._8_4_ * auVar29._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar32._8_4_ * auVar32._8_4_;
    auVar25._12_4_ =
         auVar29._12_4_ * auVar29._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar32._12_4_ * auVar32._12_4_;
    auVar19._0_4_ = fVar18 * fVar18;
    auVar19._4_4_ = fVar21 * fVar21;
    auVar19._8_4_ = fVar22 * fVar22;
    auVar19._12_4_ = fVar23 * fVar23;
    auVar29 = vcmpps_avx(auVar25,auVar19,2);
    auVar37 = auVar28 & auVar29;
    if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar37[0xf] < '\0')
    {
      auVar28 = vandps_avx(auVar28,auVar29);
      auVar27._0_4_ = fVar36 * fVar36 + fVar42 * fVar42 + fVar50 * fVar50;
      auVar27._4_4_ = fVar38 * fVar38 + fVar43 * fVar43 + fVar51 * fVar51;
      auVar27._8_4_ = fVar39 * fVar39 + fVar44 * fVar44 + fVar52 * fVar52;
      auVar27._12_4_ = fVar40 * fVar40 + fVar45 * fVar45 + fVar53 * fVar53;
      auVar29 = vcmpps_avx(auVar27,auVar19,6);
      auVar37 = auVar29 & auVar28;
      if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar37[0xf] < '\0'
         ) {
        auVar28 = vandps_avx(auVar28,auVar29);
        local_a8 = ZEXT432(0) << 0x20;
        local_78[0] = -fVar1;
        local_78[1] = -fVar1;
        local_78[2] = -fVar1;
        local_78[3] = -fVar1;
        local_68[0] = -fVar2;
        local_68[1] = -fVar2;
        local_68[2] = -fVar2;
        local_68[3] = -fVar2;
        local_58[0] = -fVar3;
        local_58[1] = -fVar3;
        local_58[2] = -fVar3;
        local_58[3] = -fVar3;
        local_128 = auVar28;
        auVar33._8_4_ = 0x7f800000;
        auVar33._0_8_ = 0x7f8000007f800000;
        auVar33._12_4_ = 0x7f800000;
        auVar34 = ZEXT1664(auVar33);
        auVar29 = vblendvps_avx(auVar33,local_88,auVar28);
        auVar37 = vshufps_avx(auVar29,auVar29,0xb1);
        auVar37 = vminps_avx(auVar37,auVar29);
        auVar32 = vshufpd_avx(auVar37,auVar37,1);
        auVar37 = vminps_avx(auVar32,auVar37);
        auVar29 = vcmpps_avx(auVar29,auVar37,0);
        auVar37 = auVar28 & auVar29;
        if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar37[0xf] < '\0') {
          auVar28 = vandps_avx(auVar29,auVar28);
        }
        uVar9 = vmovmskps_avx(auVar28);
        lVar13 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        do {
          local_100[0]._0_4_ = *(undefined4 *)(local_48 + lVar13 * 4);
          pRVar11 = (RayHit *)(ulong)(uint)local_100[0]._0_4_;
          pGVar5 = (pSVar4->geometries).items[(long)pRVar11].ptr;
          if ((pGVar5->mask & (ray->super_RayK<1>).mask) == 0) {
            *(undefined4 *)(local_118 + lVar13 * 4 + -0x10) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar1 = *(float *)(local_a8 + lVar13 * 4);
              fVar2 = *(float *)(local_a8 + lVar13 * 4 + 0x10);
              (ray->super_RayK<1>).tfar = local_78[lVar13 + -4];
              (ray->Ng).field_0.field_0.x = local_78[lVar13];
              (ray->Ng).field_0.field_0.y = local_68[lVar13];
              (ray->Ng).field_0.field_0.z = local_58[lVar13];
              ray->u = fVar1;
              ray->v = fVar2;
              ray->primID = (Disc->primIDs).field_0.i[lVar13];
              ray->geomID = local_100[0]._0_4_;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              return;
            }
            local_118._0_4_ = local_78[lVar13];
            local_118._4_4_ = local_68[lVar13];
            local_110 = local_58[lVar13];
            local_10c = *(int *)(local_a8 + lVar13 * 4);
            local_108 = *(int *)(local_a8 + lVar13 * 4 + 0x10);
            local_104 = (Disc->primIDs).field_0.i[lVar13];
            local_100[0].field_0.y = context->user->instID[0];
            local_100[0].field_0.z = context->user->instPrimID[0];
            local_130._4_4_ = (ray->super_RayK<1>).tfar;
            (ray->super_RayK<1>).tfar = local_78[lVar13 + -4];
            local_130._0_4_ = -NAN;
            local_e8.valid = (int *)local_130;
            local_e8.geometryUserPtr = pGVar5->userPtr;
            local_e8.context = context->user;
            local_e8.ray = (RTCRayN *)ray;
            local_e8.hit = local_118;
            local_e8.N = 1;
            local_b8 = auVar58._0_16_;
            if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00fb8d70:
              p_Var8 = context->args->filter;
              if (p_Var8 != (RTCFilterFunctionN)0x0) {
                if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                {
                  (*p_Var8)(&local_e8);
                  auVar34 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  auVar58 = ZEXT1664(local_b8);
                }
                if ((((RayK<1> *)local_e8.valid)->org).field_0.m128[0] == 0.0) goto LAB_00fb8e65;
              }
              (((Vec3f *)((long)local_e8.ray + 0x30))->field_0).field_0.x = *(float *)local_e8.hit;
              (((Vec3f *)((long)local_e8.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_e8.hit + 4);
              (((Vec3f *)((long)local_e8.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_e8.hit + 8);
              *(float *)((long)local_e8.ray + 0x3c) = *(float *)(local_e8.hit + 0xc);
              *(float *)((long)local_e8.ray + 0x40) = *(float *)(local_e8.hit + 0x10);
              *(uint *)((long)local_e8.ray + 0x44) = *(uint *)(local_e8.hit + 0x14);
              *(uint *)((long)local_e8.ray + 0x48) = *(uint *)(local_e8.hit + 0x18);
              *(uint *)((long)local_e8.ray + 0x4c) = *(uint *)(local_e8.hit + 0x1c);
              *(uint *)((long)local_e8.ray + 0x50) = *(uint *)(local_e8.hit + 0x20);
              pRVar11 = (RayHit *)local_e8.ray;
            }
            else {
              (*pGVar5->intersectionFilterN)(&local_e8);
              auVar34 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar58 = ZEXT1664(local_b8);
              if ((((RayK<1> *)local_e8.valid)->org).field_0.m128[0] != 0.0) goto LAB_00fb8d70;
LAB_00fb8e65:
              (ray->super_RayK<1>).tfar = (float)local_130._4_4_;
              pRVar11 = (RayHit *)local_e8.valid;
            }
            *(undefined4 *)(local_118 + lVar13 * 4 + -0x10) = 0;
            fVar1 = (ray->super_RayK<1>).tfar;
            auVar20._4_4_ = fVar1;
            auVar20._0_4_ = fVar1;
            auVar20._8_4_ = fVar1;
            auVar20._12_4_ = fVar1;
            auVar28 = vcmpps_avx(auVar58._0_16_,auVar20,2);
            local_128 = vandps_avx(auVar28,local_128);
          }
          if ((((local_128 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_128 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_128 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_128[0xf]) {
            return;
          }
          auVar28 = vblendvps_avx(auVar34._0_16_,auVar58._0_16_,local_128);
          auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
          auVar29 = vminps_avx(auVar29,auVar28);
          auVar37 = vshufpd_avx(auVar29,auVar29,1);
          auVar29 = vminps_avx(auVar37,auVar29);
          auVar29 = vcmpps_avx(auVar28,auVar29,0);
          auVar37 = local_128 & auVar29;
          auVar28 = local_128;
          if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar37[0xf] < '\0') {
            auVar28 = vandps_avx(auVar29,local_128);
          }
          uVar10 = vmovmskps_avx(auVar28);
          uVar12 = CONCAT44((int)((ulong)pRVar11 >> 0x20),uVar10);
          lVar13 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }